

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dave.cpp
# Opt level: O0

void __thiscall Enterprise::Dave::Audio::update_channel(Audio *this,int c)

{
  uint local_18;
  int output;
  int c_local;
  Audio *this_local;
  
  local_18 = this->channels_[c].output & 1;
  this->channels_[c].output = this->channels_[c].output << 1;
  if ((this->channels_[c].sync & 1U) == 0) {
    if (this->channels_[c].count == 0) {
      this->channels_[c].count = this->channels_[c].reload;
      if (this->channels_[c].distortion == None) {
        local_18 = local_18 ^ 1;
      }
      else {
        local_18 = (uint)this->poly_state_[(int)this->channels_[c].distortion];
      }
    }
    else {
      this->channels_[c].count = this->channels_[c].count - 1;
    }
    if (((this->channels_[c].high_pass & 1U) != 0) &&
       ((this->channels_[(c + 1) % 3].output & 3U) == 2)) {
      local_18 = 0;
    }
  }
  else {
    this->channels_[c].count = this->channels_[c].reload;
    local_18 = 0;
  }
  if ((this->channels_[c].ring_modulate & 1U) != 0) {
    local_18 = (local_18 ^ this->channels_[(c + 2) % 3].output ^ 0xffffffff) & 1;
  }
  this->channels_[c].output = local_18 | this->channels_[c].output;
  return;
}

Assistant:

void Audio::update_channel(int c) {
	auto output = channels_[c].output & 1;
	channels_[c].output <<= 1;
	if(channels_[c].sync) {
		channels_[c].count = channels_[c].reload;
		output = 0;
	} else {
		if(!channels_[c].count) {
			channels_[c].count = channels_[c].reload;

			if(channels_[c].distortion == Channel::Distortion::None)
				output ^= 1;
			else
				output = poly_state_[int(channels_[c].distortion)];
		} else {
			--channels_[c].count;
		}

		if(channels_[c].high_pass && (channels_[(c+1)%3].output&3) == 2) {
			output = 0;
		}
	}

	// Ring modulation applies even when sync is enabled, per SIDBasic.
	if(channels_[c].ring_modulate) {
		output = ~(output ^ channels_[(c+2)%3].output) & 1;
	}

	channels_[c].output |= output;
}